

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_ext(lys_module *module,void *actual,char *ext_name,char *ext_arg,
                    yytokentype actual_type,yytokentype backup_type,int is_ext_instance)

{
  uint8_t uVar1;
  int iVar2;
  char *pcVar3;
  uint8_t local_49;
  LY_STMT LStack_44;
  uint8_t insubstmt_index;
  LYEXT_SUBSTMT insubstmt;
  LY_STMT stmt;
  lys_ext_instance *instance;
  yytokentype backup_type_local;
  yytokentype actual_type_local;
  char *ext_arg_local;
  char *ext_name_local;
  void *actual_local;
  lys_module *module_local;
  
  LStack_44 = LY_STMT_UNKNOWN;
  local_49 = '\0';
  if (backup_type == NODE) {
    if (actual_type == ARGUMENT_KEYWORD) {
      uVar1 = '\x01';
      LStack_44 = LY_STMT_ARGUMENT;
    }
    else if (actual_type == BELONGS_TO_KEYWORD) {
      uVar1 = '\x03';
      LStack_44 = LY_STMT_BELONGSTO;
    }
    else {
      uVar1 = '\0';
    }
    _insubstmt = (lys_module *)yang_ext_instance(actual,actual_type,is_ext_instance);
  }
  else {
    switch(actual_type) {
    case BASE_KEYWORD:
      uVar1 = '\x02';
      LStack_44 = LY_STMT_BASE;
      if (backup_type == IDENTITY_KEYWORD) {
        local_49 = *(uint8_t *)((long)actual + 0x1f);
      }
      else if (backup_type == TYPE_KEYWORD) {
        local_49 = (uint8_t)*(undefined4 *)(*(long *)((long)actual + 0x10) + 0x28);
      }
      break;
    default:
      ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_yang.c"
             ,0x96e);
      return (void *)0x0;
    case CONFIG_KEYWORD:
      uVar1 = '\x17';
      LStack_44 = LY_STMT_CONFIG;
      break;
    case CONTACT_KEYWORD:
      uVar1 = '\x04';
      LStack_44 = LY_STMT_CONTACT;
      break;
    case DEFAULT_KEYWORD:
      uVar1 = '\x05';
      LStack_44 = LY_STMT_DEFAULT;
      if (backup_type == LEAF_LIST_KEYWORD) {
        local_49 = *(uint8_t *)((long)actual + 0x1e);
      }
      else if (backup_type == REFINE_KEYWORD) {
        local_49 = *(uint8_t *)((long)actual + 0x1f);
      }
      else if (backup_type == ADD_KEYWORD) {
        local_49 = *(uint8_t *)((long)actual + 5);
      }
      break;
    case DESCRIPTION_KEYWORD:
      uVar1 = '\x06';
      LStack_44 = LY_STMT_DESCRIPTION;
      break;
    case ERROR_APP_TAG_KEYWORD:
      uVar1 = '\a';
      LStack_44 = LY_STMT_ERRTAG;
      break;
    case ERROR_MESSAGE_KEYWORD:
      uVar1 = '\b';
      LStack_44 = LY_STMT_ERRMSG;
      break;
    case FRACTION_DIGITS_KEYWORD:
      uVar1 = '\x1b';
      LStack_44 = LY_STMT_DIGITS;
      break;
    case KEY_KEYWORD:
      uVar1 = '\t';
      LStack_44 = LY_STMT_KEY;
      break;
    case MANDATORY_KEYWORD:
      uVar1 = '\x18';
      LStack_44 = LY_STMT_MANDATORY;
      break;
    case MAX_ELEMENTS_KEYWORD:
      uVar1 = '\x1c';
      LStack_44 = LY_STMT_MAX;
      break;
    case MIN_ELEMENTS_KEYWORD:
      uVar1 = '\x1d';
      LStack_44 = LY_STMT_MIN;
      break;
    case NAMESPACE_KEYWORD:
      uVar1 = '\n';
      LStack_44 = LY_STMT_NAMESPACE;
      break;
    case ORDERED_BY_KEYWORD:
      uVar1 = '\x19';
      LStack_44 = LY_STMT_ORDEREDBY;
      break;
    case ORGANIZATION_KEYWORD:
      uVar1 = '\v';
      LStack_44 = LY_STMT_ORGANIZATION;
      break;
    case PATH_KEYWORD:
      uVar1 = '\f';
      LStack_44 = LY_STMT_PATH;
      break;
    case POSITION_KEYWORD:
      uVar1 = '\x1e';
      LStack_44 = LY_STMT_POSITION;
      break;
    case PREFIX_KEYWORD:
      uVar1 = '\r';
      LStack_44 = LY_STMT_PREFIX;
      break;
    case PRESENCE_KEYWORD:
      uVar1 = '\x0e';
      LStack_44 = LY_STMT_PRESENCE;
      break;
    case REFERENCE_KEYWORD:
      uVar1 = '\x0f';
      LStack_44 = LY_STMT_REFERENCE;
      break;
    case REQUIRE_INSTANCE_KEYWORD:
      uVar1 = '\x15';
      LStack_44 = LY_STMT_REQINSTANCE;
      break;
    case REVISION_DATE_KEYWORD:
      uVar1 = '\x10';
      LStack_44 = LY_STMT_REVISIONDATE;
      break;
    case STATUS_KEYWORD:
      uVar1 = '\x1a';
      LStack_44 = LY_STMT_STATUS;
      break;
    case UNIQUE_KEYWORD:
      uVar1 = '\x1f';
      LStack_44 = LY_STMT_UNIQUE;
      if (backup_type == LIST_KEYWORD) {
        local_49 = *(uint8_t *)((long)actual + 0x1f);
      }
      else if (((backup_type == ADD_KEYWORD) || (backup_type == DELETE_KEYWORD)) ||
              (backup_type == REPLACE_KEYWORD)) {
        local_49 = *(uint8_t *)((long)actual + 10);
      }
      break;
    case UNITS_KEYWORD:
      uVar1 = '\x11';
      LStack_44 = LY_STMT_UNITS;
      break;
    case VALUE_KEYWORD:
      uVar1 = '\x12';
      LStack_44 = LY_STMT_VALUE;
      break;
    case YANG_VERSION_KEYWORD:
      uVar1 = '\x13';
      LStack_44 = LY_STMT_VERSION;
      break;
    case YIN_ELEMENT_KEYWORD:
      uVar1 = '\x16';
      LStack_44 = LY_STMT_YINELEM;
      break;
    case MODIFIER_KEYWORD:
      uVar1 = '\x14';
      LStack_44 = LY_STMT_MODIFIER;
    }
    _insubstmt = (lys_module *)yang_ext_instance(actual,backup_type,is_ext_instance);
  }
  if (_insubstmt == (lys_module *)0x0) {
    module_local = (lys_module *)0x0;
  }
  else {
    *(uint8_t *)((long)&_insubstmt->dsc + 4) = uVar1;
    *(uint8_t *)((long)&_insubstmt->dsc + 3) = local_49;
    *(ushort *)&_insubstmt->dsc = *(ushort *)&_insubstmt->dsc | 2;
    _insubstmt->ctx = (ly_ctx *)ext_name;
    pcVar3 = lydict_insert_zc(module->ctx,ext_arg);
    _insubstmt->prefix = pcVar3;
    if (((is_ext_instance != 0) && (LStack_44 != LY_STMT_UNKNOWN)) &&
       (*(uint8_t *)((long)&_insubstmt->dsc + 5) == '\v')) {
      iVar2 = yang_fill_ext_substm_index((lys_ext_instance_complex *)actual,LStack_44,backup_type);
      *(uint8_t *)((long)&_insubstmt->dsc + 3) = (uint8_t)iVar2;
    }
    module_local = _insubstmt;
  }
  return module_local;
}

Assistant:

void *
yang_read_ext(struct lys_module *module, void *actual, char *ext_name, char *ext_arg,
              enum yytokentype actual_type, enum yytokentype backup_type, int is_ext_instance)
{
    struct lys_ext_instance *instance;
    LY_STMT stmt = LY_STMT_UNKNOWN;
    LYEXT_SUBSTMT insubstmt;
    uint8_t insubstmt_index = 0;

    if (backup_type != NODE) {
        switch (actual_type) {
        case YANG_VERSION_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_VERSION;
            stmt = LY_STMT_VERSION;
            break;
        case NAMESPACE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_NAMESPACE;
            stmt = LY_STMT_NAMESPACE;
            break;
        case PREFIX_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_PREFIX;
            stmt = LY_STMT_PREFIX;
            break;
        case REVISION_DATE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_REVISIONDATE;
            stmt = LY_STMT_REVISIONDATE;
            break;
        case DESCRIPTION_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_DESCRIPTION;
            stmt = LY_STMT_DESCRIPTION;
            break;
        case REFERENCE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_REFERENCE;
            stmt = LY_STMT_REFERENCE;
            break;
        case CONTACT_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_CONTACT;
            stmt = LY_STMT_CONTACT;
            break;
        case ORGANIZATION_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ORGANIZATION;
            stmt = LY_STMT_ORGANIZATION;
            break;
        case YIN_ELEMENT_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_YINELEM;
            stmt = LY_STMT_YINELEM;
            break;
        case STATUS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_STATUS;
            stmt = LY_STMT_STATUS;
            break;
        case BASE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_BASE;
            stmt = LY_STMT_BASE;
            if (backup_type == IDENTITY_KEYWORD) {
                insubstmt_index = ((struct lys_ident *)actual)->base_size;
            } else if (backup_type == TYPE_KEYWORD) {
                insubstmt_index = ((struct yang_type *)actual)->type->info.ident.count;
            }
            break;
        case DEFAULT_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_DEFAULT;
            stmt = LY_STMT_DEFAULT;
            switch (backup_type) {
            case LEAF_LIST_KEYWORD:
                insubstmt_index = ((struct lys_node_leaflist *)actual)->dflt_size;
                break;
            case REFINE_KEYWORD:
                insubstmt_index = ((struct lys_refine *)actual)->dflt_size;
                break;
            case ADD_KEYWORD:
                insubstmt_index = ((struct lys_deviate *)actual)->dflt_size;
                break;
            default:
                /* nothing changes */
                break;
            }
            break;
        case UNITS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_UNITS;
            stmt = LY_STMT_UNITS;
            break;
        case REQUIRE_INSTANCE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_REQINSTANCE;
            stmt = LY_STMT_REQINSTANCE;
            break;
        case PATH_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_PATH;
            stmt = LY_STMT_PATH;
            break;
        case ERROR_MESSAGE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ERRMSG;
            stmt = LY_STMT_ERRMSG;
            break;
        case ERROR_APP_TAG_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ERRTAG;
            stmt = LY_STMT_ERRTAG;
            break;
        case MODIFIER_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_MODIFIER;
            stmt = LY_STMT_MODIFIER;
            break;
        case FRACTION_DIGITS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_DIGITS;
            stmt = LY_STMT_DIGITS;
            break;
        case VALUE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_VALUE;
            stmt = LY_STMT_VALUE;
            break;
        case POSITION_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_POSITION;
            stmt = LY_STMT_POSITION;
            break;
        case PRESENCE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_PRESENCE;
            stmt = LY_STMT_PRESENCE;
            break;
        case CONFIG_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_CONFIG;
            stmt = LY_STMT_CONFIG;
            break;
        case MANDATORY_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_MANDATORY;
            stmt = LY_STMT_MANDATORY;
            break;
        case MIN_ELEMENTS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_MIN;
            stmt = LY_STMT_MIN;
            break;
        case MAX_ELEMENTS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_MAX;
            stmt = LY_STMT_MAX;
            break;
        case ORDERED_BY_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ORDEREDBY;
            stmt = LY_STMT_ORDEREDBY;
            break;
        case KEY_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_KEY;
            stmt = LY_STMT_KEY;
            break;
        case UNIQUE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_UNIQUE;
            stmt = LY_STMT_UNIQUE;
            switch (backup_type) {
            case LIST_KEYWORD:
                insubstmt_index = ((struct lys_node_list *)actual)->unique_size;
                break;
            case ADD_KEYWORD:
            case DELETE_KEYWORD:
            case REPLACE_KEYWORD:
                insubstmt_index = ((struct lys_deviate *)actual)->unique_size;
                break;
            default:
                /* nothing changes */
                break;
            }
            break;
        default:
            LOGINT(module->ctx);
            return NULL;
        }

        instance = yang_ext_instance(actual, backup_type, is_ext_instance);
    } else {
        switch (actual_type) {
        case ARGUMENT_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ARGUMENT;
            stmt = LY_STMT_ARGUMENT;
            break;
        case BELONGS_TO_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_BELONGSTO;
            stmt = LY_STMT_BELONGSTO;
            break;
        default:
            insubstmt = LYEXT_SUBSTMT_SELF;
            break;
        }

        instance = yang_ext_instance(actual, actual_type, is_ext_instance);
    }

    if (!instance) {
        return NULL;
    }
    instance->insubstmt = insubstmt;
    instance->insubstmt_index = insubstmt_index;
    instance->flags |= LYEXT_OPT_YANG;
    instance->def = (struct lys_ext *)ext_name;    /* hack for UNRES */
    instance->arg_value = lydict_insert_zc(module->ctx, ext_arg);
    if (is_ext_instance && stmt != LY_STMT_UNKNOWN && instance->parent_type == LYEXT_PAR_EXTINST) {
        instance->insubstmt_index = yang_fill_ext_substm_index(actual, stmt, backup_type);
    }
    return instance;
}